

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O3

Acec_Box_t *
Acec_FindBox(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Wec_t *vAddBoxes,Vec_Wec_t *vXorLeaves,
            Vec_Int_t *vXorRoots)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Vec_Bit_t *vVisit;
  int *piVar9;
  byte *__s;
  Acec_Box_t *pAVar10;
  Vec_Wec_t *pVVar11;
  Vec_Int_t *pVVar12;
  Vec_Wec_t *pVVar13;
  Vec_Int_t *pVVar14;
  uint uVar15;
  char *__function;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  size_t sVar21;
  char *__file;
  char *__assertion;
  long lVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  void *local_b0;
  
  uVar15 = vAddBoxes->nSize;
  uVar20 = vAdds->nSize;
  iVar18 = (((int)uVar20 / 6 >> 5) + 1) - (uint)(((int)uVar20 / 6 & 0x1fU) == 0);
  vVisit = (Vec_Bit_t *)malloc(0x10);
  vVisit->nCap = iVar18 * 0x20;
  if (iVar18 == 0) {
    sVar21 = 0;
    piVar9 = (int *)0x0;
  }
  else {
    sVar21 = (long)iVar18 << 2;
    piVar9 = (int *)malloc(sVar21);
  }
  vVisit->pArray = piVar9;
  vVisit->nSize = iVar18 * 0x20;
  memset(piVar9,0,sVar21);
  iVar18 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  if (iVar18 == 0) {
    local_b0 = (void *)0x0;
    sVar21 = 0;
    __s = (byte *)0x0;
  }
  else {
    sVar21 = (long)iVar18 << 2;
    local_b0 = calloc(1,sVar21);
    __s = (byte *)malloc(sVar21);
  }
  pVVar12 = (Vec_Int_t *)0x0;
  memset(__s,0,sVar21);
  pAVar10 = (Acec_Box_t *)calloc(1,0x30);
  pAVar10->pGia = p;
  pAVar10->vAdds = vAddBoxes;
  pVVar11 = (Vec_Wec_t *)malloc(0x10);
  uVar7 = 8;
  if (6 < uVar15 - 1) {
    uVar7 = uVar15;
  }
  pVVar11->nCap = uVar7;
  if (uVar7 != 0) {
    pVVar12 = (Vec_Int_t *)calloc((long)(int)uVar7,0x10);
  }
  pVVar11->pArray = pVVar12;
  pVVar11->nSize = uVar15;
  pAVar10->vLeafLits = pVVar11;
  pVVar13 = (Vec_Wec_t *)malloc(0x10);
  pVVar13->nCap = uVar7;
  if (uVar7 == 0) {
    pVVar12 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar12 = (Vec_Int_t *)calloc((long)(int)uVar7,0x10);
  }
  pVVar13->pArray = pVVar12;
  pVVar13->nSize = uVar15;
  pAVar10->vRootLits = pVVar13;
  if (uVar15 != vXorLeaves->nSize) {
    __assert_fail("Vec_WecSize(vAddBoxes) == Vec_WecSize(vXorLeaves)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecXor.c"
                  ,0x131,
                  "Acec_Box_t *Acec_FindBox(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *)"
                 );
  }
  if (uVar15 == vXorRoots->nSize) {
    uVar7 = iVar18 * 0x20;
    if (0 < (int)uVar15) {
      pVVar12 = vAddBoxes->pArray;
      uVar17 = 0;
      do {
        if (0 < pVVar12[uVar17].nSize) {
          piVar9 = pVVar12[uVar17].pArray;
          lVar22 = 0;
          do {
            iVar8 = piVar9[lVar22];
            if (iVar8 < 0) goto LAB_00688f9d;
            uVar3 = iVar8 * 6;
            if (uVar20 == uVar3 || SBORROW4(uVar20,uVar3) != (int)(uVar20 + iVar8 * -6) < 0)
            goto LAB_00688f9d;
            piVar4 = vAdds->pArray;
            uVar2 = piVar4[uVar3];
            if (((int)uVar2 < 0) || ((int)uVar7 <= (int)uVar2)) goto LAB_00688fdb;
            puVar1 = (uint *)((long)local_b0 + (ulong)(uVar2 >> 5) * 4);
            *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
            if (uVar20 <= (uVar3 | 1)) goto LAB_00688f9d;
            uVar2 = piVar4[uVar3 | 1];
            if (((int)uVar2 < 0) || (uVar7 <= uVar2)) goto LAB_00688fdb;
            puVar1 = (uint *)((long)local_b0 + (ulong)(uVar2 >> 5) * 4);
            *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
            if (uVar20 <= uVar3 + 2) goto LAB_00688f9d;
            uVar2 = piVar4[uVar3 + 2];
            if (((int)uVar2 < 0) || (uVar7 <= uVar2)) goto LAB_00688fdb;
            puVar1 = (uint *)((long)local_b0 + (ulong)(uVar2 >> 5) * 4);
            *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
            if (uVar20 <= uVar3 + 3) goto LAB_00688f9d;
            uVar2 = piVar4[uVar3 + 3];
            if (((int)uVar2 < 0) || (uVar7 <= uVar2)) goto LAB_00688fdb;
            *(uint *)(__s + (ulong)(uVar2 >> 5) * 4) =
                 *(uint *)(__s + (ulong)(uVar2 >> 5) * 4) | 1 << ((byte)uVar2 & 0x1f);
            if (uVar20 <= uVar3 + 4) goto LAB_00688f9d;
            uVar3 = piVar4[uVar3 + 4];
            if (((int)uVar3 < 0) || (uVar7 <= uVar3)) goto LAB_00688fdb;
            *(uint *)(__s + (ulong)(uVar3 >> 5) * 4) =
                 *(uint *)(__s + (ulong)(uVar3 >> 5) * 4) | 1 << ((byte)uVar3 & 0x1f);
            lVar22 = lVar22 + 1;
          } while (lVar22 < pVVar12[uVar17].nSize);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar15);
      if (0 < (int)uVar15) {
        lVar22 = 8;
        lVar26 = 0;
        do {
          qsort(*(void **)((long)&vAddBoxes->pArray->nCap + lVar22),
                (long)*(int *)((long)vAddBoxes->pArray + lVar22 + -4),4,Vec_IntSortCompare1);
          lVar26 = lVar26 + 1;
          lVar22 = lVar22 + 0x10;
        } while (lVar26 < vAddBoxes->nSize);
      }
    }
    pVVar12 = Acec_TreeCarryMap(p,vAdds,vAddBoxes);
    lVar22 = (long)vAddBoxes->nSize;
    if (0 < (long)vAddBoxes->nSize) {
      do {
        if (vAddBoxes->nSize < lVar22) goto LAB_00688ffa;
        lVar26 = lVar22 + -1;
        pVVar14 = vAddBoxes->pArray;
        iVar8 = pVVar14[lVar26].nSize;
        if (0 < iVar8) {
          lVar24 = 0;
          do {
            iVar19 = pVVar14[lVar26].pArray[lVar24];
            if ((iVar19 < 0) || (uVar15 = iVar19 * 6 + 4, vAdds->nSize <= (int)uVar15))
            goto LAB_00688f9d;
            uVar15 = vAdds->pArray[uVar15];
            if (((int)uVar15 < 0) || ((int)uVar7 <= (int)uVar15)) {
LAB_00688fbc:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                            ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
            }
            if ((*(uint *)((long)local_b0 + (ulong)(uVar15 >> 5) * 4) >> (uVar15 & 0x1f) & 1) == 0)
            {
              Acec_TreePhases_rec(p,vAdds,pVVar12,uVar15,
                                  (uint)(vAdds->pArray[(ulong)(uint)(iVar19 * 6) + 2] != 0),vVisit);
              iVar8 = pVVar14[lVar26].nSize;
            }
            lVar24 = lVar24 + 1;
          } while (lVar24 < iVar8);
        }
        bVar5 = 1 < lVar22;
        lVar22 = lVar26;
      } while (bVar5);
    }
    Acec_TreeVerifyPhases(p,vAdds,vAddBoxes);
    Acec_TreeVerifyPhases2(p,vAdds,vAddBoxes);
    if (vVisit->pArray != (int *)0x0) {
      free(vVisit->pArray);
    }
    free(vVisit);
    if (pVVar12->pArray != (int *)0x0) {
      free(pVVar12->pArray);
    }
    free(pVVar12);
    if (0 < iVar18) {
      *__s = *__s | 1;
      iVar18 = vAddBoxes->nSize;
      if (0 < iVar18) {
        lVar22 = 0;
        do {
          pVVar12 = vAddBoxes->pArray;
          if (0 < pVVar12[lVar22].nSize) {
            uVar15 = (int)lVar22 + 1;
            lVar26 = 0;
            do {
              iVar18 = pVVar12[lVar22].pArray[lVar26];
              iVar8 = iVar18 * 6;
              uVar20 = iVar18 * 6 + 5;
              uVar17 = (ulong)uVar20;
              lVar23 = (long)iVar8;
              lVar24 = 0;
              do {
                if ((iVar18 < 0) || ((long)vAdds->nSize <= lVar23 + lVar24)) goto LAB_00688f9d;
                uVar3 = vAdds->pArray[lVar23 + lVar24];
                if (((int)uVar3 < 0) || ((int)uVar7 <= (int)uVar3)) goto LAB_00688fbc;
                if ((*(uint *)(__s + (ulong)(uVar3 >> 5) * 4) >> (uVar3 & 0x1f) & 1) == 0) {
                  if (vAdds->nSize <= (int)uVar20) goto LAB_00688f9d;
                  uVar2 = vAdds->pArray[uVar17];
                  if (pVVar11->nSize <= lVar22) {
                    uVar25 = pVVar11->nSize * 2;
                    if ((int)uVar25 <= (int)uVar15) {
                      uVar25 = uVar15;
                    }
                    iVar19 = pVVar11->nCap;
                    if (iVar19 < (int)uVar25) {
                      if (pVVar11->pArray == (Vec_Int_t *)0x0) {
                        pVVar14 = (Vec_Int_t *)malloc((ulong)uVar25 << 4);
                      }
                      else {
                        pVVar14 = (Vec_Int_t *)realloc(pVVar11->pArray,(ulong)uVar25 << 4);
                        iVar19 = pVVar11->nCap;
                      }
                      pVVar11->pArray = pVVar14;
                      memset(pVVar14 + iVar19,0,(long)(int)(uVar25 - iVar19) << 4);
                      pVVar11->nCap = uVar25;
                    }
                    pVVar11->nSize = uVar15;
                  }
                  Vec_IntPush(pVVar11->pArray + lVar22,
                              (uint)((uVar2 >> ((byte)((byte)lVar24 | 0x10) & 0x1f) & 1) != 0) +
                              uVar3 * 2);
                }
                lVar24 = lVar24 + 1;
              } while (lVar24 != 3);
              lVar24 = 3;
              do {
                if ((iVar8 + 3 < 0) || ((long)vAdds->nSize <= lVar23 + lVar24)) goto LAB_00688f9d;
                uVar3 = vAdds->pArray[lVar23 + lVar24];
                if (((int)uVar3 < 0) || ((int)uVar7 <= (int)uVar3)) goto LAB_00688fbc;
                if ((*(uint *)((long)local_b0 + (ulong)(uVar3 >> 5) * 4) >> (uVar3 & 0x1f) & 1) == 0
                   ) {
                  if (vAdds->nSize <= (int)uVar20) goto LAB_00688f9d;
                  uVar25 = (uint)(lVar24 == 4) + (int)lVar22;
                  uVar2 = vAdds->pArray[uVar17];
                  if (pVVar13->nSize <= (int)uVar25) {
                    uVar16 = uVar25 + 1;
                    uVar6 = pVVar13->nSize * 2;
                    if ((int)uVar6 <= (int)uVar16) {
                      uVar6 = uVar16;
                    }
                    iVar18 = pVVar13->nCap;
                    if (iVar18 < (int)uVar6) {
                      if (pVVar13->pArray == (Vec_Int_t *)0x0) {
                        pVVar14 = (Vec_Int_t *)malloc((ulong)uVar6 << 4);
                      }
                      else {
                        pVVar14 = (Vec_Int_t *)realloc(pVVar13->pArray,(ulong)uVar6 << 4);
                        iVar18 = pVVar13->nCap;
                      }
                      pVVar13->pArray = pVVar14;
                      memset(pVVar14 + iVar18,0,(long)(int)(uVar6 - iVar18) << 4);
                      pVVar13->nCap = uVar6;
                    }
                    pVVar13->nSize = uVar16;
                  }
                  Vec_IntPush(pVVar13->pArray + uVar25,
                              (uint)((uVar2 >> ((byte)((byte)lVar24 | 0x10) & 0x1f) & 1) != 0) +
                              uVar3 * 2);
                }
                lVar24 = lVar24 + 1;
              } while (lVar24 != 5);
              if (vAdds->nSize <= (int)(iVar8 + 2U)) goto LAB_00688f9d;
              if (vAdds->pArray[iVar8 + 2U] == 0) {
                if ((uint)vAdds->nSize <= uVar20) {
LAB_00688f9d:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                if ((*(byte *)((long)vAdds->pArray + uVar17 * 4 + 2) & 4) != 0) {
                  if (pVVar11->nSize <= lVar22) {
                    uVar20 = pVVar11->nSize * 2;
                    if ((int)uVar20 <= (int)uVar15) {
                      uVar20 = uVar15;
                    }
                    iVar18 = pVVar11->nCap;
                    if (iVar18 < (int)uVar20) {
                      if (pVVar11->pArray == (Vec_Int_t *)0x0) {
                        pVVar14 = (Vec_Int_t *)malloc((ulong)uVar20 << 4);
                      }
                      else {
                        pVVar14 = (Vec_Int_t *)realloc(pVVar11->pArray,(ulong)uVar20 << 4);
                        iVar18 = pVVar11->nCap;
                      }
                      pVVar11->pArray = pVVar14;
                      memset(pVVar14 + iVar18,0,(long)(int)(uVar20 - iVar18) << 4);
                      pVVar11->nCap = uVar20;
                    }
                    pVVar11->nSize = uVar15;
                  }
                  Vec_IntPush(pVVar11->pArray + lVar22,1);
                }
              }
              lVar26 = lVar26 + 1;
            } while (lVar26 < pVVar12[lVar22].nSize);
            iVar18 = vAddBoxes->nSize;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 < iVar18);
      }
      if (local_b0 != (void *)0x0) {
        free(local_b0);
      }
      free(__s);
      lVar22 = (long)pVVar11->nSize;
      if ((0 < lVar22) && (lVar26 = (long)vXorLeaves->nSize, 0 < lVar26)) {
        pVVar12 = pVVar11->pArray;
        if ((pVVar12[lVar22 + -1].nSize == 0) &&
           (pVVar14 = vXorLeaves->pArray, 0 < pVVar14[lVar26 + -1].nSize)) {
          lVar24 = 0;
          do {
            if (pVVar14[lVar26 + -1].pArray[lVar24] < 0) goto LAB_00689019;
            Vec_IntPush(pVVar12 + lVar22 + -1,pVVar14[lVar26 + -1].pArray[lVar24] * 2);
            lVar24 = lVar24 + 1;
          } while (lVar24 < pVVar14[lVar26 + -1].nSize);
        }
        lVar22 = (long)pVVar13->nSize;
        if (0 < lVar22) {
          if ((long)vXorRoots->nSize < 1) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
          }
          iVar18 = vXorRoots->pArray[(long)vXorRoots->nSize + -1];
          if (-1 < iVar18) {
            pVVar12 = pVVar13->pArray;
            piVar9 = pVVar12[lVar22 + -1].pArray;
            if (pVVar12[lVar22 + -1].nCap < 1) {
              if (piVar9 == (int *)0x0) {
                piVar9 = (int *)malloc(4);
              }
              else {
                piVar9 = (int *)realloc(piVar9,4);
              }
              pVVar12[lVar22 + -1].pArray = piVar9;
              if (piVar9 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              pVVar12[lVar22 + -1].nCap = 1;
            }
            *piVar9 = iVar18 * 2;
            pVVar12[lVar22 + -1].nSize = 1;
            if (0 < pVVar11->nSize) {
              lVar22 = 8;
              lVar26 = 0;
              do {
                qsort(*(void **)((long)&pVVar11->pArray->nCap + lVar22),
                      (long)*(int *)((long)pVVar11->pArray + lVar22 + -4),4,Vec_IntSortCompare1);
                lVar26 = lVar26 + 1;
                lVar22 = lVar22 + 0x10;
              } while (lVar26 < pVVar11->nSize);
            }
            if (0 < pVVar13->nSize) {
              lVar22 = 8;
              lVar26 = 0;
              do {
                qsort(*(void **)((long)&pVVar13->pArray->nCap + lVar22),
                      (long)*(int *)((long)pVVar13->pArray + lVar22 + -4),4,Vec_IntSortCompare2);
                lVar26 = lVar26 + 1;
                lVar22 = lVar22 + 0x10;
              } while (lVar26 < pVVar13->nSize);
            }
            return pAVar10;
          }
LAB_00689019:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
      }
LAB_00688ffa:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
LAB_00688fdb:
    __assertion = "i >= 0 && i < p->nSize";
    __file = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h";
    __function = "void Vec_BitWriteEntry(Vec_Bit_t *, int, int)";
  }
  else {
    __assertion = "Vec_WecSize(vAddBoxes) == Vec_IntSize(vXorRoots)";
    __file = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecXor.c";
    __function = 
    "Acec_Box_t *Acec_FindBox(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *)";
  }
  __assert_fail(__assertion,__file,0x132,__function);
}

Assistant:

Acec_Box_t * Acec_FindBox( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vAddBoxes, Vec_Wec_t * vXorLeaves, Vec_Int_t * vXorRoots )
{
    extern Vec_Int_t * Acec_TreeCarryMap( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes );
    extern void Acec_TreePhases_rec( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vMap, int Node, int fPhase, Vec_Bit_t * vVisit );
    extern void Acec_TreeVerifyPhases( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes );
    extern void Acec_TreeVerifyPhases2( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes );

    int MaxRank = Vec_WecSize( vAddBoxes );
    Vec_Bit_t * vVisit  = Vec_BitStart( Vec_IntSize(vAdds)/6 );
    Vec_Bit_t * vIsLeaf = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vIsRoot = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel, * vLevel2, * vMap;
    int i, j, k, Box, Node;

    Acec_Box_t * pBox = ABC_CALLOC( Acec_Box_t, 1 );
    pBox->pGia        = p;
    pBox->vAdds       = vAddBoxes; // Vec_WecDup( vAddBoxes );
    pBox->vLeafLits   = Vec_WecStart( MaxRank + 0 );
    pBox->vRootLits   = Vec_WecStart( MaxRank + 0 );

    assert( Vec_WecSize(vAddBoxes) == Vec_WecSize(vXorLeaves) );
    assert( Vec_WecSize(vAddBoxes) == Vec_IntSize(vXorRoots) );

    // collect boxes; mark inputs/outputs
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
    Vec_IntForEachEntry( vLevel, Box, k )
    {
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+0), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+1), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+2), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+3), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+4), 1 );
    }
    // sort each level
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
        Vec_IntSort( vLevel, 0 );

    // set phases starting from roots
    vMap = Acec_TreeCarryMap( p, vAdds, pBox->vAdds );
    Vec_WecForEachLevelReverse( pBox->vAdds, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
            if ( !Vec_BitEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+4) ) )
            {
                //printf( "Pushing phase of output %d of box %d\n", Vec_IntEntry(vAdds, 6*Box+4), Box );
                Acec_TreePhases_rec( p, vAdds, vMap, Vec_IntEntry(vAdds, 6*Box+4), Vec_IntEntry(vAdds, 6*Box+2) != 0, vVisit );
            }
    Acec_TreeVerifyPhases( p, vAdds, pBox->vAdds );
    Acec_TreeVerifyPhases2( p, vAdds, pBox->vAdds );
    Vec_BitFree( vVisit );
    Vec_IntFree( vMap );

    // collect inputs/outputs
    Vec_BitWriteEntry( vIsRoot, 0, 1 );
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, j )
        {
            for ( k = 0; k < 3; k++ )
                if ( !Vec_BitEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+k) ) )
                    Vec_WecPush( pBox->vLeafLits, i, Abc_Var2Lit(Vec_IntEntry(vAdds, 6*Box+k), Acec_SignBit2(vAdds, Box, k)) );
            for ( k = 3; k < 5; k++ )
                if ( !Vec_BitEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+k) ) )
                    Vec_WecPush( pBox->vRootLits, k == 4 ? i + 1 : i, Abc_Var2Lit(Vec_IntEntry(vAdds, 6*Box+k), Acec_SignBit2(vAdds, Box, k)) );
            if ( Vec_IntEntry(vAdds, 6*Box+2) == 0 && Acec_SignBit2(vAdds, Box, 2) )
                Vec_WecPush( pBox->vLeafLits, i, 1 );
        }
    Vec_BitFree( vIsLeaf );
    Vec_BitFree( vIsRoot );

    // collect last bit
    vLevel  = Vec_WecEntry( pBox->vLeafLits, Vec_WecSize(pBox->vLeafLits)-1 );
    vLevel2 = Vec_WecEntry( vXorLeaves, Vec_WecSize(vXorLeaves)-1 );
    if ( Vec_IntSize(vLevel) == 0 && Vec_IntSize(vLevel2) > 0 )
    {
        Vec_IntForEachEntry( vLevel2, Node, k )
            Vec_IntPush( vLevel, Abc_Var2Lit(Node, 0) );
    }
    vLevel  = Vec_WecEntry( pBox->vRootLits, Vec_WecSize(pBox->vRootLits)-1 );
    Vec_IntFill( vLevel, 1, Abc_Var2Lit(Vec_IntEntryLast(vXorRoots), 0) );

    // sort each level
    Vec_WecForEachLevel( pBox->vLeafLits, vLevel, i )
        Vec_IntSort( vLevel, 0 );
    Vec_WecForEachLevel( pBox->vRootLits, vLevel, i )
        Vec_IntSort( vLevel, 1 );

    //Acec_CheckBoothPPs( p, pBox->vLeafLits );
    return pBox;
}